

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid_soa.cpp
# Opt level: O3

pair<embree::NodeRefPtr<4>,_embree::LBBox<embree::Vec3fa>_> * __thiscall
embree::sse2::GridSOA::buildMBlurBVH
          (pair<embree::NodeRefPtr<4>,_embree::LBBox<embree::Vec3fa>_> *__return_storage_ptr__,
          GridSOA *this,size_t time,GridRange *range,size_t *allocator)

{
  uint uVar1;
  size_t sVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint v_size;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint *puVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  uint v_size_1;
  uint uVar15;
  uint u_size;
  uint uVar16;
  GridRange *range_00;
  float fVar17;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar18;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar19;
  undefined4 in_XMM2_Db;
  undefined4 in_XMM2_Dd;
  undefined1 auVar20 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar21;
  undefined1 auVar22 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  pair<embree::NodeRefPtr<4>,_embree::LBBox<embree::Vec3fa>_> node_bounds;
  GridRange local_128;
  uint local_118 [12];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_e8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_d8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_c8;
  char *local_b0;
  size_t *local_a8;
  size_t local_a0;
  float local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  pair<embree::NodeRefPtr<4>,_embree::LBBox<embree::Vec3fa>_> local_88;
  
  uVar6 = range->u_start;
  uVar1 = range->u_end;
  if ((uVar1 - uVar6) + 1 < 4) {
    uVar5 = range->v_end;
    uVar10 = range->v_start;
    uVar9 = (ulong)uVar10;
    if ((uVar5 - uVar10) + 1 < 4) {
      uVar12 = this->width;
      lVar14 = uVar12 * uVar9;
      aVar18 = _DAT_01f7a9f0;
      aVar19 = _DAT_01f7aa00;
      aVar21 = _DAT_01f7a9f0;
      aVar23 = _DAT_01f7aa00;
      if (uVar10 <= uVar5) {
        uVar15 = this->dim_offset;
        lVar3 = this->gridBytes * time + (ulong)this->gridOffset + 0x30;
        iVar13 = uVar10 * uVar12;
        uVar8 = uVar6;
        uVar16 = uVar10;
        do {
          for (; uVar8 <= uVar1; uVar8 = uVar8 + 1) {
            uVar7 = (ulong)(iVar13 + uVar8);
            auVar20._4_4_ =
                 *(undefined4 *)(this->data + uVar7 * 4 + (ulong)uVar15 * 4 + lVar3 + -0x30);
            auVar20._0_4_ = *(undefined4 *)(this->data + uVar7 * 4 + lVar3 + -0x30);
            auVar20._8_4_ =
                 *(undefined4 *)(this->data + uVar7 * 4 + (ulong)(uVar15 * 2) * 4 + lVar3 + -0x30);
            auVar20._12_4_ = 0;
            aVar18.m128 = (__m128)minps(aVar18.m128,auVar20);
            aVar19.m128 = (__m128)maxps(aVar19.m128,auVar20);
          }
          uVar16 = uVar16 + 1;
          iVar13 = iVar13 + uVar12;
          uVar8 = uVar6;
        } while (uVar16 <= uVar5);
        if (uVar10 <= uVar5) {
          lVar3 = (time + 1) * (ulong)this->gridBytes + (ulong)this->gridOffset + 0x30;
          iVar13 = uVar10 * uVar12;
          uVar10 = uVar6;
          do {
            for (; uVar10 <= uVar1; uVar10 = uVar10 + 1) {
              uVar7 = (ulong)(iVar13 + uVar10);
              auVar22._4_4_ =
                   *(undefined4 *)(this->data + uVar7 * 4 + (ulong)uVar15 * 4 + lVar3 + -0x30);
              auVar22._0_4_ = *(undefined4 *)(this->data + uVar7 * 4 + lVar3 + -0x30);
              auVar22._8_4_ =
                   *(undefined4 *)(this->data + uVar7 * 4 + (ulong)(uVar15 * 2) * 4 + lVar3 + -0x30)
              ;
              auVar22._12_4_ = 0;
              aVar21.m128 = (__m128)minps(aVar21.m128,auVar22);
              aVar23.m128 = (__m128)maxps(aVar23.m128,auVar22);
            }
            uVar8 = (int)uVar9 + 1;
            uVar9 = (ulong)uVar8;
            iVar13 = iVar13 + uVar12;
            uVar10 = uVar6;
          } while (uVar8 <= uVar5);
        }
      }
      (__return_storage_ptr__->first).ptr = (lVar14 + (ulong)uVar6) * 0x10 + 0x18;
      (__return_storage_ptr__->second).bounds0.lower.field_0 = aVar18;
      (__return_storage_ptr__->second).bounds0.upper.field_0 = aVar19;
      (__return_storage_ptr__->second).bounds1.lower.field_0 = aVar21;
      (__return_storage_ptr__->second).bounds1.upper.field_0 = aVar23;
      return __return_storage_ptr__;
    }
  }
  sVar2 = *allocator;
  *allocator = sVar2 + 0xe0;
  local_c8 = _DAT_01f7a9f0;
  *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(this[2].data + (sVar2 - 0x10)) = _DAT_01f7a9f0;
  *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(this[2].data + (sVar2 - 0x30)) = local_c8;
  *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(this[1].data + (sVar2 - 0x18)) = local_c8;
  aVar18 = _DAT_01f7aa00;
  *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(this[2].data + sVar2) = _DAT_01f7aa00;
  *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(this[2].data + (sVar2 - 0x20)) = aVar18;
  *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(this[1].data + (sVar2 - 8)) = aVar18;
  *(undefined8 *)(this[3].data + (sVar2 - 0x28)) = 0;
  *(undefined8 *)(this[3].data + (sVar2 - 0x28) + 8) = 0;
  *(undefined8 *)(this[3].data + (sVar2 - 0x18)) = 0;
  *(undefined8 *)(this[3].data + (sVar2 - 0x18) + 8) = 0;
  *(undefined8 *)(this[3].data + (sVar2 - 8)) = 0;
  *(undefined8 *)(this[3].data + (sVar2 - 8) + 8) = 0;
  *(undefined8 *)(this[4].data + (sVar2 - 0x30)) = 0;
  *(undefined8 *)(this[4].data + (sVar2 - 0x30) + 8) = 0;
  *(undefined8 *)(this[4].data + (sVar2 - 0x20)) = 0;
  *(undefined8 *)(this[4].data + (sVar2 - 0x20) + 8) = 0;
  *(undefined8 *)(this[4].data + (sVar2 - 0x10)) = 0;
  *(undefined8 *)(this[4].data + (sVar2 - 0x10) + 8) = 0;
  *(undefined8 *)(this->data + sVar2) = 8;
  *(undefined8 *)(this->data + sVar2 + 8) = 8;
  *(undefined8 *)(this[1].data + (sVar2 - 0x28)) = 8;
  *(undefined8 *)(this[1].data + (sVar2 - 0x28) + 8) = 8;
  local_128.u_start = range->u_start;
  uVar6 = range->u_end;
  uVar1 = range->v_end;
  local_128.v_start = range->v_start;
  if ((uVar6 - local_128.u_start) + 1 < (uVar1 - local_128.v_start) + 1) {
    uVar5 = local_128.v_start + uVar1 >> 1;
    uVar10 = local_128.u_start;
    uVar12 = uVar6;
    uVar15 = uVar5;
  }
  else {
    uVar10 = local_128.u_start + uVar6 >> 1;
    uVar5 = local_128.v_start;
    uVar12 = uVar10;
    uVar15 = uVar1;
  }
  uVar16 = (uVar12 - local_128.u_start) + 1;
  uVar8 = (uVar15 - local_128.v_start) + 1;
  local_128.u_end = uVar12;
  local_128.v_end = uVar15;
  if ((uVar8 | uVar16) < 4) {
    iVar13 = 1;
  }
  else {
    if (uVar16 < uVar8) {
      local_118[2] = uVar15 + local_128.v_start >> 1;
      local_128.v_end = local_118[2];
      local_118[0] = local_128.u_start;
    }
    else {
      local_128.u_end = uVar12 + local_128.u_start >> 1;
      local_118[0] = local_128.u_end;
      local_118[2] = local_128.v_start;
    }
    iVar13 = 2;
    local_118[1] = uVar12;
    local_118[3] = uVar15;
  }
  uVar12 = (uVar6 - uVar10) + 1;
  uVar15 = (uVar1 - uVar5) + 1;
  uVar9 = (ulong)(uint)(iVar13 << 4);
  puVar11 = (uint *)((long)&local_128.u_start + uVar9);
  if ((uVar15 | uVar12) < 4) {
    *puVar11 = uVar10;
    *(uint *)((long)local_118 + (uVar9 - 0xc)) = uVar6;
    *(uint *)((long)local_118 + (uVar9 - 8)) = uVar5;
    *(uint *)((long)local_118 + (uVar9 - 4)) = uVar1;
    iVar4 = 1;
  }
  else {
    *puVar11 = uVar10;
    *(uint *)((long)local_118 + (uVar9 - 0xc)) = uVar6;
    *(uint *)((long)local_118 + (uVar9 - 8)) = uVar5;
    *(uint *)((long)local_118 + (uVar9 - 4)) = uVar1;
    *(uint *)((long)local_118 + uVar9) = uVar10;
    *(uint *)((long)local_118 + uVar9 + 4) = uVar6;
    *(uint *)((long)local_118 + uVar9 + 8) = uVar5;
    *(uint *)((long)local_118 + uVar9 + 0xc) = uVar1;
    if (uVar12 < uVar15) {
      uVar6 = uVar5 + uVar1 >> 1;
      *(uint *)((long)local_118 + (uVar9 - 4)) = uVar6;
      *(uint *)((long)local_118 + uVar9 + 8) = uVar6;
    }
    else {
      uVar6 = uVar10 + uVar6 >> 1;
      *(uint *)((long)local_118 + (uVar9 - 0xc)) = uVar6;
      *(uint *)((long)local_118 + uVar9) = uVar6;
    }
    iVar4 = 2;
  }
  local_b0 = this->data + sVar2;
  range_00 = &local_128;
  uVar9 = 0;
  local_d8 = aVar18;
  local_e8 = local_c8;
  local_a8 = allocator;
  local_a0 = time;
  do {
    fVar17 = (float)(this->time_steps - 1);
    local_98 = (float)time / fVar17;
    uStack_90 = 0;
    uStack_94 = in_XMM2_Db;
    uStack_8c = in_XMM2_Dd;
    buildMBlurBVH(&local_88,this,local_a0,range_00,allocator);
    *(size_t *)(this->data + uVar9 * 8 + sVar2) = local_88.first.ptr;
    fVar24 = 1.0 / ((float)(time + 1) / fVar17 - local_98);
    fVar32 = -local_98 * fVar24;
    fVar17 = 1.0 - fVar32;
    auVar26._0_4_ =
         local_88.second.bounds0.lower.field_0._0_4_ * fVar17 +
         local_88.second.bounds1.lower.field_0._0_4_ * fVar32;
    auVar26._4_4_ =
         local_88.second.bounds0.lower.field_0._4_4_ * fVar17 +
         local_88.second.bounds1.lower.field_0._4_4_ * fVar32;
    auVar26._8_4_ =
         local_88.second.bounds0.lower.field_0._8_4_ * fVar17 +
         local_88.second.bounds1.lower.field_0._8_4_ * fVar32;
    auVar26._12_4_ =
         local_88.second.bounds0.lower.field_0._12_4_ * fVar17 +
         local_88.second.bounds1.lower.field_0._12_4_ * fVar32;
    auVar28._0_4_ =
         fVar17 * local_88.second.bounds0.upper.field_0._0_4_ +
         fVar32 * local_88.second.bounds1.upper.field_0._0_4_;
    auVar28._4_4_ =
         fVar17 * local_88.second.bounds0.upper.field_0._4_4_ +
         fVar32 * local_88.second.bounds1.upper.field_0._4_4_;
    auVar28._8_4_ =
         fVar17 * local_88.second.bounds0.upper.field_0._8_4_ +
         fVar32 * local_88.second.bounds1.upper.field_0._8_4_;
    auVar28._12_4_ =
         fVar17 * local_88.second.bounds0.upper.field_0._12_4_ +
         fVar32 * local_88.second.bounds1.upper.field_0._12_4_;
    local_e8.m128 = (__m128)minps(local_e8.m128,local_88.second.bounds1.lower.field_0);
    local_c8.m128 = (__m128)minps(local_c8.m128,local_88.second.bounds0.lower.field_0);
    fVar24 = (1.0 - local_98) * fVar24;
    fVar17 = 1.0 - fVar24;
    auVar27._0_4_ =
         local_88.second.bounds0.lower.field_0._0_4_ * fVar17 +
         local_88.second.bounds1.lower.field_0._0_4_ * fVar24;
    auVar27._4_4_ =
         local_88.second.bounds0.lower.field_0._4_4_ * fVar17 +
         local_88.second.bounds1.lower.field_0._4_4_ * fVar24;
    auVar27._8_4_ =
         local_88.second.bounds0.lower.field_0._8_4_ * fVar17 +
         local_88.second.bounds1.lower.field_0._8_4_ * fVar24;
    auVar27._12_4_ =
         local_88.second.bounds0.lower.field_0._12_4_ * fVar17 +
         local_88.second.bounds1.lower.field_0._12_4_ * fVar24;
    auVar25._0_4_ =
         fVar17 * local_88.second.bounds0.upper.field_0._0_4_ +
         fVar24 * local_88.second.bounds1.upper.field_0._0_4_;
    auVar25._4_4_ =
         fVar17 * local_88.second.bounds0.upper.field_0._4_4_ +
         fVar24 * local_88.second.bounds1.upper.field_0._4_4_;
    auVar25._8_4_ =
         fVar17 * local_88.second.bounds0.upper.field_0._8_4_ +
         fVar24 * local_88.second.bounds1.upper.field_0._8_4_;
    auVar25._12_4_ =
         fVar17 * local_88.second.bounds0.upper.field_0._12_4_ +
         fVar24 * local_88.second.bounds1.upper.field_0._12_4_;
    auVar20 = minps(auVar26,_DAT_01f80810);
    auVar22 = maxps(auVar28,_DAT_01f80800);
    auVar28 = minps(auVar27,_DAT_01f80810);
    auVar26 = maxps(auVar25,_DAT_01f80800);
    fVar17 = auVar20._0_4_ - ABS(auVar20._0_4_) * 4.7683716e-07;
    fVar24 = auVar20._4_4_ - ABS(auVar20._4_4_) * 4.7683716e-07;
    fVar32 = auVar20._8_4_ - ABS(auVar20._8_4_) * 4.7683716e-07;
    fVar29 = ABS(auVar22._0_4_) * 4.7683716e-07 + auVar22._0_4_;
    fVar30 = ABS(auVar22._4_4_) * 4.7683716e-07 + auVar22._4_4_;
    fVar31 = ABS(auVar22._8_4_) * 4.7683716e-07 + auVar22._8_4_;
    *(float *)(this[1].data + uVar9 * 4 + sVar2 + -0x18) = fVar17;
    *(float *)(this[2].data + uVar9 * 4 + sVar2 + -0x30) = fVar24;
    *(float *)(this[2].data + uVar9 * 4 + sVar2 + -0x10) = fVar32;
    *(float *)(this[1].data + uVar9 * 4 + sVar2 + -8) = fVar29;
    *(float *)(this[2].data + uVar9 * 4 + sVar2 + -0x20) = fVar30;
    *(float *)(this[2].data + uVar9 * 4 + sVar2) = fVar31;
    *(float *)(this[3].data + uVar9 * 4 + sVar2 + -0x28) =
         (auVar28._0_4_ - ABS(auVar28._0_4_) * 4.7683716e-07) - fVar17;
    *(float *)(this[3].data + uVar9 * 4 + sVar2 + -8) =
         (auVar28._4_4_ - ABS(auVar28._4_4_) * 4.7683716e-07) - fVar24;
    *(float *)(this[4].data + uVar9 * 4 + sVar2 + -0x20) =
         (auVar28._8_4_ - ABS(auVar28._8_4_) * 4.7683716e-07) - fVar32;
    *(float *)(this[3].data + uVar9 * 4 + sVar2 + -0x18) =
         (ABS(auVar26._0_4_) * 4.7683716e-07 + auVar26._0_4_) - fVar29;
    *(float *)(this[4].data + uVar9 * 4 + sVar2 + -0x30) =
         (ABS(auVar26._4_4_) * 4.7683716e-07 + auVar26._4_4_) - fVar30;
    in_XMM2_Db = 0;
    in_XMM2_Dd = 0;
    *(float *)(this[4].data + uVar9 * 4 + sVar2 + -0x10) =
         (ABS(auVar26._8_4_) * 4.7683716e-07 + auVar26._8_4_) - fVar31;
    local_d8.m128 = (__m128)maxps(local_d8.m128,local_88.second.bounds0.upper.field_0);
    aVar18.m128 = (__m128)maxps(aVar18.m128,local_88.second.bounds1.upper.field_0);
    uVar9 = uVar9 + 1;
    range_00 = range_00 + 1;
  } while ((uint)(iVar13 + iVar4) != uVar9);
  (__return_storage_ptr__->first).ptr = (ulong)local_b0 | 1;
  (__return_storage_ptr__->second).bounds0.lower.field_0 = local_c8;
  (__return_storage_ptr__->second).bounds0.upper.field_0 = local_d8;
  (__return_storage_ptr__->second).bounds1.lower.field_0 = local_e8;
  (__return_storage_ptr__->second).bounds1.upper.field_0 = aVar18;
  return __return_storage_ptr__;
}

Assistant:

std::pair<BVH4::NodeRef,LBBox3fa> GridSOA::buildMBlurBVH(size_t time, const GridRange& range, size_t& allocator)
    {
      /*! create leaf node */
      if (unlikely(range.hasLeafSize()))
      {
        /* we store index of first subgrid vertex as leaf node */
        BVH4::NodeRef curNode = BVH4::encodeTypedLeaf(encodeLeaf(range.u_start,range.v_start),0);

        /* return bounding box */
        const BBox3fa b0 = calculateBounds(time+0,range);
        const BBox3fa b1 = calculateBounds(time+1,range);
        return std::make_pair(curNode,LBBox3fa(b0,b1));
      }
      
      /* create internal node */
      else 
      {
        /* allocate new bvh4 node */
        BVH4::AABBNodeMB* node = (BVH4::AABBNodeMB *)&bvhData()[allocator];
        allocator += sizeof(BVH4::AABBNodeMB);
        node->clear();
        
        /* split range */
        GridRange r[4];
        const unsigned children = range.splitIntoSubRanges(r);
      
        /* recurse into subtrees */
        LBBox3fa bounds(empty);
        for (unsigned i=0; i<children; i++)
        {
          const BBox1f time_range(float(time+0)/float(time_steps-1),
                                  float(time+1)/float(time_steps-1));
          std::pair<BVH4::NodeRef,LBBox3fa> node_bounds = buildMBlurBVH(time, r[i], allocator);
          node->setRef(i,node_bounds.first);
          node->setBounds(i,node_bounds.second.global(time_range));
          bounds.extend(node_bounds.second);
        }
        assert(is_finite(bounds.bounds0));
        assert(is_finite(bounds.bounds1));
        
        return std::make_pair(BVH4::encodeNode(node),bounds);
      }
    }